

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Molecule.cpp
# Opt level: O1

void __thiscall OpenMD::Molecule::addBend(Molecule *this,Bend *bend)

{
  pointer *pppBVar1;
  iterator __position;
  __normal_iterator<OpenMD::Bend_**,_std::vector<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>_>
  _Var2;
  Bend *local_10;
  
  local_10 = bend;
  _Var2 = std::
          __find_if<__gnu_cxx::__normal_iterator<OpenMD::Bend**,std::vector<OpenMD::Bend*,std::allocator<OpenMD::Bend*>>>,__gnu_cxx::__ops::_Iter_equals_val<OpenMD::Bend*const>>
                    ((this->bends_).
                     super__Vector_base<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     (this->bends_).
                     super__Vector_base<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>._M_impl.
                     super__Vector_impl_data._M_finish);
  __position._M_current =
       (this->bends_).super__Vector_base<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (_Var2._M_current == __position._M_current) {
    if (__position._M_current ==
        (this->bends_).super__Vector_base<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<OpenMD::Bend*,std::allocator<OpenMD::Bend*>>::
      _M_realloc_insert<OpenMD::Bend*const&>
                ((vector<OpenMD::Bend*,std::allocator<OpenMD::Bend*>> *)&this->bends_,__position,
                 &local_10);
    }
    else {
      *__position._M_current = local_10;
      pppBVar1 = &(this->bends_).super__Vector_base<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      *pppBVar1 = *pppBVar1 + 1;
    }
  }
  return;
}

Assistant:

void Molecule::addBend(Bend* bend) {
    if (std::find(bends_.begin(), bends_.end(), bend) == bends_.end()) {
      bends_.push_back(bend);
    }
  }